

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O0

void __thiscall KDReports::Test::testHorizontalScaling(Test *this)

{
  double dVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  AutoTableElement *pAVar5;
  reference this_00;
  QString *pQVar6;
  char *pcVar7;
  QList<QRect> *pQVar8;
  QRect local_168;
  QRect local_158;
  QList<QRect> local_148;
  QList<QRect> local_130;
  QString local_118;
  QByteArray local_100;
  QString local_e8;
  QByteArray local_d0;
  QList<QRect> local_b8;
  int local_a0;
  undefined4 local_9c;
  int columns;
  QString local_88;
  QFont local_70 [16];
  AutoTableElement local_60 [48];
  Report local_30 [8];
  Report report;
  int totalColumns;
  Test *this_local;
  
  fillModel(this,0x14,4,false);
  KDReports::Report::Report(local_30,(QObject *)0x0);
  KDReports::Report::setReportMode((ReportMode)local_30);
  pAVar5 = (AutoTableElement *)KDReports::Report::mainTable();
  KDReports::AutoTableElement::AutoTableElement(local_60,(QAbstractItemModel *)&this->m_model);
  KDReports::MainTable::setAutoTableElement(pAVar5);
  KDReports::AutoTableElement::~AutoTableElement(local_60);
  KDReports::Report::scaleTo((int)local_30,2);
  QLatin1String::QLatin1String((QLatin1String *)&columns,"Noto Sans");
  QString::QString(&local_88,_columns);
  QFont::QFont(local_70,&local_88,0x30,-1,false);
  KDReports::Report::setDefaultFont((QFont *)local_30);
  QFont::~QFont(local_70);
  QString::~QString(&local_88);
  iVar4 = KDReports::Report::numberOfPages();
  bVar2 = QTest::qCompare(iVar4,2,"report.numberOfPages()","2",
                          "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                          ,0xf1);
  if ((bVar2 & 1) == 0) {
    local_9c = 1;
  }
  else {
    KDReports::Report::mainTable();
    dVar1 = (double)KDReports::MainTable::lastAutoFontScalingFactor();
    bVar2 = QTest::qVerify(dVar1 < 0.9,"report.mainTable()->lastAutoFontScalingFactor() < 0.9","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0xf2);
    if ((bVar2 & 1) == 0) {
      local_9c = 1;
    }
    else {
      KDReports::Report::mainTable();
      KDReports::MainTable::pageRects();
      this_00 = QList<QRect>::operator[](&local_b8,0);
      iVar4 = QRect::width(this_00);
      QList<QRect>::~QList(&local_b8);
      local_a0 = iVar4;
      if ((iVar4 < 10) || (0xf < iVar4)) {
        QString::number((int)&local_118,iVar4);
        pQVar6 = QtPrivate::asString(&local_118);
        QString::toLocal8Bit(&local_100,pQVar6);
        pcVar7 = QByteArray::constData(&local_100);
        bVar2 = QTest::qVerify(false,"columns >= 10 && columns <= 15",pcVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                               ,0xf5);
        QByteArray::~QByteArray(&local_100);
        QString::~QString(&local_118);
        if (((bVar2 ^ 0xff) & 1) != 0) {
          local_9c = 1;
          goto LAB_001098c9;
        }
      }
      else {
        QString::number((int)&local_e8,iVar4);
        pQVar6 = QtPrivate::asString(&local_e8);
        QString::toLocal8Bit(&local_d0,pQVar6);
        pcVar7 = QByteArray::constData(&local_d0);
        bVar2 = QTest::qVerify(true,"columns >= 10 && columns <= 15",pcVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                               ,0xf5);
        QByteArray::~QByteArray(&local_d0);
        QString::~QString(&local_e8);
        if (((bVar2 ^ 0xff) & 1) != 0) {
          local_9c = 1;
          goto LAB_001098c9;
        }
      }
      KDReports::Report::mainTable();
      KDReports::MainTable::pageRects();
      local_148.d.d = (Data *)0x0;
      local_148.d.ptr = (QRect *)0x0;
      local_148.d.size = 0;
      QList<QRect>::QList(&local_148);
      QRect::QRect(&local_158,0,0,local_a0,4);
      pQVar8 = QList<QRect>::operator<<(&local_148,&local_158);
      QRect::QRect(&local_168,local_a0,0,0x14 - local_a0,4);
      pQVar8 = QList<QRect>::operator<<(pQVar8,&local_168);
      bVar3 = QTest::qCompare<QRect>
                        (&local_130,pQVar8,"report.mainTable()->pageRects()",
                         "QList<QRect>() << QRect(0, 0, columns, 4) << QRect(columns, 0, totalColumns - columns, 4)"
                         ,
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                         ,0xf6);
      QList<QRect>::~QList(&local_148);
      QList<QRect>::~QList(&local_130);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        local_9c = 0;
      }
      else {
        local_9c = 1;
      }
    }
  }
LAB_001098c9:
  KDReports::Report::~Report(local_30);
  return;
}

Assistant:

void testHorizontalScaling()
    {
        const int totalColumns = 20;
        fillModel(totalColumns, 4);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        report.mainTable()->setAutoTableElement(AutoTableElement(&m_model));
        report.scaleTo(2, 1); // must fit in two pages horizontally
        report.setDefaultFont(QFont(QLatin1String(s_fontName), 48));
        QCOMPARE(report.numberOfPages(), 2);
        QVERIFY(report.mainTable()->lastAutoFontScalingFactor() < 0.9);
        // qDebug() << report.mainTable()->pageRects();
        const int columns = report.mainTable()->pageRects()[0].width();
        QVERIFY2(columns >= 10 && columns <= 15, qPrintable(QString::number(columns)));
        QCOMPARE(report.mainTable()->pageRects(), QList<QRect>() << QRect(0, 0, columns, 4) << QRect(columns, 0, totalColumns - columns, 4));
    }